

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__return_storage_ptr__,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  SignParameter *this;
  pointer pSVar1;
  size_t __n;
  pointer *ppuVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  iterator __position;
  CfdException *pCVar6;
  pointer pSVar7;
  bool bVar8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signature_list;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  string pubkey_hex;
  Pubkey related_pubkey;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign_param;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Pubkey local_110;
  CfdSourceLocation local_f8;
  Script *local_d8;
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [24];
  SignParameter local_a8;
  
  pSVar7 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar7 == pSVar1) ||
     (0xf < (ulong)(((long)pSVar1 - (long)pSVar7 >> 3) * -0x1111111111111111))) {
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction.cpp";
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x2dc;
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CheckMultisig";
    core::logger::log<unsigned_int_const&>
              ((CfdSourceLocation *)(local_c0 + 0x18),kCfdLogLevelWarning,
               "Failed to CheckMultisig. sign array is \'1 - {}\'.",&kMaximumMultisigKeyNum);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_c0 + 0x18),"Value out of range. sign array length fail.","");
    core::CfdException::CfdException(pCVar6,kCfdOutOfRangeError,(string *)(local_c0 + 0x18));
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_d8 = redeem_script;
  cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)local_c0,(uint *)redeem_script);
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector(&local_148,sign_list)
  ;
  local_d0 = (pointer)local_c0._8_8_;
  if (local_c0._0_8_ != local_c0._8_8_) {
    this = (SignParameter *)(local_c0 + 0x18);
    do {
      local_c8 = (pointer)local_c0._0_8_;
      cfd::core::Pubkey::GetHex_abi_cxx11_();
      __position._M_current =
           local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current !=
             local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        SignParameter::SignParameter(this,__position._M_current);
        SignParameter::GetRelatedPubkey(&local_110,this);
        cVar4 = cfd::core::Pubkey::IsValid();
        if (cVar4 == '\0') {
LAB_001d30b1:
          __position._M_current = __position._M_current + 1;
        }
        else {
          cfd::core::Pubkey::GetHex_abi_cxx11_();
          pcVar3 = local_f8.filename;
          __n = CONCAT44(local_f8._12_4_,local_f8.line);
          if (__n == local_130._M_string_length) {
            if (__n == 0) {
              bVar8 = false;
            }
            else {
              iVar5 = bcmp(local_f8.filename,local_130._M_dataplus._M_p,__n);
              bVar8 = iVar5 != 0;
            }
          }
          else {
            bVar8 = true;
          }
          if ((char **)pcVar3 != &local_f8.funcname) {
            operator_delete(pcVar3);
          }
          if (bVar8) goto LAB_001d30b1;
          __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
                       _M_erase(&local_148,__position);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (__return_storage_ptr__,this);
        }
        if (local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.op_code_.text_data_._M_dataplus._M_p !=
            &local_a8.op_code_.text_data_.field_2) {
          operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
        }
        if (local_a8.related_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.related_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      local_c0._0_8_ = local_c8 + 1;
    } while ((pointer)local_c0._0_8_ != local_d0);
  }
  if (local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar7 = local_148.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      SignParameter::GetRelatedPubkey((Pubkey *)(local_c0 + 0x18),pSVar7);
      cVar4 = cfd::core::Pubkey::IsValid();
      if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (cVar4 != '\0') {
        local_f8.filename = "cfd_transaction.cpp";
        local_f8.line = 0x2fe;
        local_f8.funcname = "CheckMultisig";
        SignParameter::GetRelatedPubkey(&local_110,pSVar7);
        cfd::core::Pubkey::GetHex_abi_cxx11_();
        cfd::core::Script::GetHex_abi_cxx11_();
        core::logger::log<std::__cxx11::string&,std::__cxx11::string_const&>
                  (&local_f8,kCfdLogLevelWarning,
                   "Failed to CheckMultisig. Missing related pubkey in script.: relatedPubkey={}, script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_c0 + 0x18),&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        ppuVar2 = (pointer *)
                  ((long)&local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10);
        if ((pointer *)
            local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
          operator_delete(local_a8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_c0 + 0x18),
                   "Missing related pubkey in script. Check your signature and pubkey pair.","");
        core::CfdException::CfdException
                  (pCVar6,kCfdIllegalArgumentError,(string *)(local_c0 + 0x18));
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (__return_storage_ptr__,pSVar7);
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != local_148.
                       super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_148);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}